

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O3

int av1_fp_compute_num_enc_workers(AV1_COMP *cpi)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int row;
  int col;
  TileInfo tile_info;
  TileInfo local_48;
  
  iVar4 = (cpi->oxcf).max_threads;
  iVar5 = 1;
  if (1 < iVar4) {
    iVar1 = (cpi->common).tiles.rows;
    if (iVar1 < 1) {
      iVar5 = 0;
    }
    else {
      iVar4 = (cpi->common).tiles.cols;
      iVar5 = 0;
      row = 0;
      do {
        if (0 < iVar4) {
          col = 0;
          do {
            av1_tile_init(&local_48,&cpi->common,row,col);
            iVar2 = av1_get_unit_rows_in_tile(&local_48,cpi->fp_block_size);
            iVar3 = av1_get_unit_cols_in_tile(&local_48,cpi->fp_block_size);
            iVar3 = iVar3 + 1 >> 1;
            if (iVar2 <= iVar3) {
              iVar3 = iVar2;
            }
            iVar5 = iVar5 + iVar3;
            col = col + 1;
          } while (iVar4 != col);
        }
        row = row + 1;
      } while (row != iVar1);
      iVar4 = (cpi->oxcf).max_threads;
    }
    if (iVar4 < iVar5) {
      iVar5 = iVar4;
    }
  }
  return iVar5;
}

Assistant:

int av1_fp_compute_num_enc_workers(AV1_COMP *cpi) {
  AV1_COMMON *cm = &cpi->common;
  const int tile_cols = cm->tiles.cols;
  const int tile_rows = cm->tiles.rows;
  int total_num_threads_row_mt = 0;
  TileInfo tile_info;

  if (cpi->oxcf.max_threads <= 1) return 1;

  for (int row = 0; row < tile_rows; row++) {
    for (int col = 0; col < tile_cols; col++) {
      av1_tile_init(&tile_info, cm, row, col);
      const int num_mb_rows_in_tile =
          av1_get_unit_rows_in_tile(&tile_info, cpi->fp_block_size);
      const int num_mb_cols_in_tile =
          av1_get_unit_cols_in_tile(&tile_info, cpi->fp_block_size);
      total_num_threads_row_mt +=
          AOMMIN((num_mb_cols_in_tile + 1) >> 1, num_mb_rows_in_tile);
    }
  }
  return AOMMIN(cpi->oxcf.max_threads, total_num_threads_row_mt);
}